

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O0

bool libwebm::CopyColour(Colour *parser_colour,Colour *muxer_colour)

{
  uint64_t value;
  uint64_t matrix_coefficients;
  uint64_t value_00;
  uint64_t cb_subsampling_vert;
  uint64_t value_01;
  uint64_t primaries;
  bool bVar1;
  Colour *in_RSI;
  MasteringMetadata *in_RDI;
  MasteringMetadata *in_stack_00000010;
  Colour *in_stack_00000018;
  MasteringMetadata muxer_mm;
  MasteringMetadata *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  if (in_RSI == (Colour *)0x0) {
    in_stack_ffffffffffffffff = 0;
  }
  else {
    value._0_4_ = in_RDI->luminance_max_;
    value._4_4_ = in_RDI->luminance_min_;
    bVar1 = ColourValuePresent(value);
    if (bVar1) {
      matrix_coefficients._0_4_ = in_RDI->luminance_max_;
      matrix_coefficients._4_4_ = in_RDI->luminance_min_;
      mkvmuxer::Colour::set_matrix_coefficients(in_RSI,matrix_coefficients);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI->r_);
    if (bVar1) {
      mkvmuxer::Colour::set_bits_per_channel(in_RSI,(uint64_t)in_RDI->r_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI->g_);
    if (bVar1) {
      mkvmuxer::Colour::set_chroma_subsampling_horz(in_RSI,(uint64_t)in_RDI->g_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI->b_);
    if (bVar1) {
      mkvmuxer::Colour::set_chroma_subsampling_vert(in_RSI,(uint64_t)in_RDI->b_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI->white_point_);
    if (bVar1) {
      mkvmuxer::Colour::set_cb_subsampling_horz(in_RSI,(uint64_t)in_RDI->white_point_);
    }
    value_00._0_4_ = in_RDI[1].luminance_max_;
    value_00._4_4_ = in_RDI[1].luminance_min_;
    bVar1 = ColourValuePresent(value_00);
    if (bVar1) {
      cb_subsampling_vert._0_4_ = in_RDI[1].luminance_max_;
      cb_subsampling_vert._4_4_ = in_RDI[1].luminance_min_;
      mkvmuxer::Colour::set_cb_subsampling_vert(in_RSI,cb_subsampling_vert);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[1].r_);
    if (bVar1) {
      mkvmuxer::Colour::set_chroma_siting_horz(in_RSI,(uint64_t)in_RDI[1].r_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[1].g_);
    if (bVar1) {
      mkvmuxer::Colour::set_chroma_siting_vert(in_RSI,(uint64_t)in_RDI[1].g_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[1].b_);
    if (bVar1) {
      mkvmuxer::Colour::set_range(in_RSI,(uint64_t)in_RDI[1].b_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[1].white_point_);
    if (bVar1) {
      mkvmuxer::Colour::set_transfer_characteristics(in_RSI,(uint64_t)in_RDI[1].white_point_);
    }
    value_01._0_4_ = in_RDI[2].luminance_max_;
    value_01._4_4_ = in_RDI[2].luminance_min_;
    bVar1 = ColourValuePresent(value_01);
    if (bVar1) {
      primaries._0_4_ = in_RDI[2].luminance_max_;
      primaries._4_4_ = in_RDI[2].luminance_min_;
      mkvmuxer::Colour::set_primaries(in_RSI,primaries);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[2].r_);
    if (bVar1) {
      mkvmuxer::Colour::set_max_cll(in_RSI,(uint64_t)in_RDI[2].r_);
    }
    bVar1 = ColourValuePresent((longlong)in_RDI[2].g_);
    if (bVar1) {
      mkvmuxer::Colour::set_max_fall(in_RSI,(uint64_t)in_RDI[2].g_);
    }
    if (in_RDI[2].b_ != (PrimaryChromaticity *)0x0) {
      mkvmuxer::MasteringMetadata::MasteringMetadata((MasteringMetadata *)&stack0xffffffffffffffc0);
      bVar1 = CopyMasteringMetadata
                        ((MasteringMetadata *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
      if (bVar1) {
        bVar1 = mkvmuxer::Colour::SetMasteringMetadata(in_stack_00000018,in_stack_00000010);
        if (bVar1) {
          bVar1 = false;
        }
        else {
          in_stack_ffffffffffffffff = 0;
          bVar1 = true;
        }
      }
      else {
        in_stack_ffffffffffffffff = 0;
        bVar1 = true;
      }
      mkvmuxer::MasteringMetadata::~MasteringMetadata(in_stack_ffffffffffffffc0);
      if (bVar1) goto LAB_00de2d07;
    }
    in_stack_ffffffffffffffff = 1;
  }
LAB_00de2d07:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool CopyColour(const mkvparser::Colour& parser_colour,
                mkvmuxer::Colour* muxer_colour) {
  if (!muxer_colour)
    return false;

  if (ColourValuePresent(parser_colour.matrix_coefficients))
    muxer_colour->set_matrix_coefficients(parser_colour.matrix_coefficients);
  if (ColourValuePresent(parser_colour.bits_per_channel))
    muxer_colour->set_bits_per_channel(parser_colour.bits_per_channel);
  if (ColourValuePresent(parser_colour.chroma_subsampling_horz)) {
    muxer_colour->set_chroma_subsampling_horz(
        parser_colour.chroma_subsampling_horz);
  }
  if (ColourValuePresent(parser_colour.chroma_subsampling_vert)) {
    muxer_colour->set_chroma_subsampling_vert(
        parser_colour.chroma_subsampling_vert);
  }
  if (ColourValuePresent(parser_colour.cb_subsampling_horz))
    muxer_colour->set_cb_subsampling_horz(parser_colour.cb_subsampling_horz);
  if (ColourValuePresent(parser_colour.cb_subsampling_vert))
    muxer_colour->set_cb_subsampling_vert(parser_colour.cb_subsampling_vert);
  if (ColourValuePresent(parser_colour.chroma_siting_horz))
    muxer_colour->set_chroma_siting_horz(parser_colour.chroma_siting_horz);
  if (ColourValuePresent(parser_colour.chroma_siting_vert))
    muxer_colour->set_chroma_siting_vert(parser_colour.chroma_siting_vert);
  if (ColourValuePresent(parser_colour.range))
    muxer_colour->set_range(parser_colour.range);
  if (ColourValuePresent(parser_colour.transfer_characteristics)) {
    muxer_colour->set_transfer_characteristics(
        parser_colour.transfer_characteristics);
  }
  if (ColourValuePresent(parser_colour.primaries))
    muxer_colour->set_primaries(parser_colour.primaries);
  if (ColourValuePresent(parser_colour.max_cll))
    muxer_colour->set_max_cll(parser_colour.max_cll);
  if (ColourValuePresent(parser_colour.max_fall))
    muxer_colour->set_max_fall(parser_colour.max_fall);

  if (parser_colour.mastering_metadata) {
    mkvmuxer::MasteringMetadata muxer_mm;
    if (!CopyMasteringMetadata(*parser_colour.mastering_metadata, &muxer_mm))
      return false;
    if (!muxer_colour->SetMasteringMetadata(muxer_mm))
      return false;
  }
  return true;
}